

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::buildDualProblem
          (SPxLPBase<double> *this,SPxLPBase<double> *dualLP,SPxRowId *primalRowIds,
          SPxColId *primalColIds,SPxRowId *dualRowIds,SPxColId *dualColIds,int *nprimalrows,
          int *nprimalcols,int *ndualrows,int *ndualcols)

{
  undefined8 uVar1;
  Tolerances *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pdVar4;
  Item *pIVar5;
  Real RVar6;
  Type TVar7;
  DataKey *pDVar8;
  undefined8 *puVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  SPxLPBase<double> *pSVar14;
  int iVar15;
  ulong uVar16;
  double *obj;
  long lVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint uVar21;
  int numprimalcols;
  int numprimalrows;
  int numdualcols;
  DataArray<soplex::SPxColId> dualcolids;
  DSVectorBase<double> col;
  LPColSetBase<double> dualcols;
  LPRowSetBase<double> dualrows;
  undefined8 local_2a8;
  DataKey local_2a0;
  DataKey local_298;
  int local_290;
  int local_28c;
  DataKey local_288;
  SPxColId *local_280;
  undefined8 local_278 [2];
  DSVectorBase<double> local_268;
  DataKey local_248;
  undefined8 uStack_240;
  SPxLPBase<double> *local_230;
  DataKey local_228;
  undefined8 uStack_220;
  Real local_210;
  DataKey local_208;
  undefined8 uStack_200;
  SPxRowId *local_1f0;
  SPxRowId *local_1e8;
  SPxColId *local_1e0;
  _func_int **local_1d8;
  SPxColId *local_1d0;
  Real local_1c8;
  undefined1 local_1c0 [8];
  SPxColId *local_1b8;
  Nonzero<double> *local_1b0;
  undefined1 local_f8 [8];
  SPxRowId *local_f0;
  Nonzero<double> *local_e8;
  
  local_230 = dualLP;
  local_1f0 = primalRowIds;
  local_1e8 = dualRowIds;
  local_1e0 = primalColIds;
  local_1d0 = dualColIds;
  if ((dualRowIds == (SPxRowId *)0x0 ||
      (primalColIds == (SPxColId *)0x0 || primalRowIds == (SPxRowId *)0x0)) ||
      dualColIds == (SPxColId *)0x0) {
    iVar15 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    local_f8._0_4_ = iVar15 * 2;
    local_f0 = (SPxRowId *)0x0;
    local_e8 = (Nonzero<double> *)0x3ff3333333333333;
    iVar10 = 0;
    if ((int)local_f8._0_4_ < 1) {
      local_f8._0_4_ = iVar10;
    }
    local_f8._4_4_ = local_f8._0_4_;
    if (iVar15 < 1) {
      local_f8._4_4_ = 1;
    }
    spx_alloc<soplex::SPxRowId*>(&local_f0,local_f8._4_4_);
    iVar15 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    local_1c0._0_4_ = iVar15 * 2;
    local_1b8 = (SPxColId *)0x0;
    local_1b0 = (Nonzero<double> *)0x3ff3333333333333;
    if ((int)local_1c0._0_4_ < 1) {
      local_1c0._0_4_ = iVar10;
    }
    local_1c0._4_4_ = local_1c0._0_4_;
    if (iVar15 < 1) {
      local_1c0._4_4_ = 1;
    }
    spx_alloc<soplex::SPxColId*>(&local_1b8,local_1c0._4_4_);
    iVar15 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    iVar11 = iVar15 * 2;
    local_268.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
    local_268.super_SVectorBase<double>.memsize = 0x33333333;
    local_268.super_SVectorBase<double>.memused = 0x3ff33333;
    if (0 < iVar11) {
      iVar10 = iVar11;
    }
    iVar11 = iVar10;
    if (iVar15 < 1) {
      iVar11 = 1;
    }
    local_268._vptr_DSVectorBase = (_func_int **)CONCAT44(iVar11,iVar10);
    spx_alloc<soplex::SPxRowId*>((SPxRowId **)&local_268.super_SVectorBase<double>,iVar11);
    iVar15 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    local_288.info = iVar15 * 2;
    local_280 = (SPxColId *)0x0;
    local_278[0] = 0x3ff3333333333333;
    if (local_288.info < 1) {
      local_288.info = 0;
    }
    local_288.idx = 1;
    if (0 < iVar15) {
      local_288.idx = local_288.info;
    }
    spx_alloc<soplex::SPxColId*>(&local_280,local_288.idx);
    local_298 = (DataKey)((ulong)(uint)local_298.idx << 0x20);
    local_2a0 = (DataKey)((ulong)(uint)local_2a0.idx << 0x20);
    local_2a8 = (double)((ulong)local_2a8._4_4_ << 0x20);
    local_290 = 0;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x4b])
              (this,local_230,local_f0,local_1b8,local_268.super_SVectorBase<double>.m_elem,
               local_280,&local_298,&local_2a0,&local_2a8,&local_290);
    if (local_1f0 != (SPxRowId *)0x0) {
      *nprimalrows = local_298.info;
    }
    if (local_1e0 != (SPxColId *)0x0) {
      *nprimalcols = local_2a0.info;
    }
    if (local_1e8 != (SPxRowId *)0x0) {
      *ndualrows = (int)local_2a8;
    }
    if (local_1d0 != (SPxColId *)0x0) {
      *ndualcols = local_290;
    }
    if (local_280 != (SPxColId *)0x0) {
      free(local_280);
      local_280 = (SPxColId *)0x0;
    }
    if (local_268.super_SVectorBase<double>.m_elem != (Nonzero<double> *)0x0) {
      free(local_268.super_SVectorBase<double>.m_elem);
      local_268.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
    }
    if (local_1b8 != (SPxColId *)0x0) {
      free(local_1b8);
      local_1b8 = (SPxColId *)0x0;
    }
    if (local_f0 != (SPxRowId *)0x0) {
      free(local_f0);
    }
  }
  else {
    (*(dualLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x45])
              (dualLP,(ulong)((uint)(this->thesense == MINIMIZE) * 2 - 1));
    LPRowSetBase<double>::LPRowSetBase
              ((LPRowSetBase<double> *)local_f8,
               (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,-1);
    LPColSetBase<double>::LPColSetBase
              ((LPColSetBase<double> *)local_1c0,
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,-1);
    local_268.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
    local_268.super_SVectorBase<double>.memsize = 0;
    local_268.super_SVectorBase<double>.memused = 0;
    local_268._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
    local_268.theelem = (Nonzero<double> *)0x0;
    spx_alloc<soplex::Nonzero<double>*>(&local_268.theelem,1);
    local_1d8 = (_func_int **)&PTR__DSVectorBase_003b0660;
    local_268.super_SVectorBase<double>.m_elem = local_268.theelem;
    local_268.super_SVectorBase<double>.memsize = 1;
    local_268.super_SVectorBase<double>.memused = 0;
    if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
      uVar16 = 0;
      local_208.info = 0;
      local_208.idx = 0;
    }
    else {
      pDVar8 = (DataKey *)__tls_get_addr(&PTR_003b6b60);
      local_228 = *pDVar8;
      uStack_220 = 0;
      local_208 = (DataKey)((ulong)local_228 ^ 0x8000000000000000);
      uStack_200 = 0x8000000000000000;
      lVar12 = 0;
      uVar16 = 0;
      local_28c = 0;
      do {
        local_298 = *(DataKey *)
                     ((long)&((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey)
                             ->info + lVar12);
        SPxColId::SPxColId((SPxColId *)&local_288,&local_298);
        *(DataKey *)((long)&(local_1e0->super_DataKey).info + lVar12) = local_288;
        local_248 = *(DataKey *)
                     ((long)(this->super_LPColSetBase<double>).low.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar12);
        ::soplex::infinity::__tls_init();
        if ((double)local_208 < (double)local_248) {
LAB_001d657b:
          local_248 = *(DataKey *)
                       ((long)(this->super_LPColSetBase<double>).low.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar12);
          ::soplex::infinity::__tls_init();
          iVar15 = (int)uVar16;
          if ((double)local_248 <= (double)local_208) {
            pTVar2 = (this->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_248 = *(DataKey *)
                         ((long)(this->super_LPColSetBase<double>).up.val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
            uStack_240 = 0;
            p_Var3 = (this->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
            }
            RVar6 = Tolerances::epsilon(pTVar2);
            uVar19 = SUB84(RVar6,0);
            uVar20 = (undefined4)((ulong)RVar6 >> 0x20);
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_210 = RVar6;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              uVar19 = SUB84(local_210,0);
              uVar20 = (undefined4)((ulong)local_210 >> 0x20);
            }
            if ((double)CONCAT44(uVar20,uVar19) < ABS((double)local_248)) {
              DSVectorBase<double>::makeMem(&local_268,1);
              local_268.super_SVectorBase<double>.m_elem
              [local_268.super_SVectorBase<double>.memused].idx = iVar15;
              local_268.super_SVectorBase<double>.m_elem
              [local_268.super_SVectorBase<double>.memused].val = 1.0;
              local_268.super_SVectorBase<double>.memused =
                   local_268.super_SVectorBase<double>.memused + 1;
              if (this->thesense == MINIMIZE) {
                pdVar4 = (this->super_LPColSetBase<double>).object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_298 = (DataKey)(*(ulong *)((long)pdVar4 + lVar12) ^ 0x8000000000000000);
                local_2a0 = (DataKey)(*(ulong *)((long)pdVar4 + lVar12) ^ 0x8000000000000000);
                local_2a8 = 0.0;
                local_290 = 0;
                local_288.info = 0;
                local_288.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                           (double *)&local_2a0,(double *)&local_2a8,&local_290);
                pdVar4 = (this->super_LPColSetBase<double>).up.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                ::soplex::infinity::__tls_init();
                local_298 = local_208;
                local_2a0.info = 0;
                local_2a0.idx = 0;
                local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                local_288.info = 0;
                local_288.idx = -1;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)local_1c0,&local_288,
                           (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                           &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                           (int *)&local_2a8);
              }
              else {
                pdVar4 = (this->super_LPColSetBase<double>).object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_298 = *(DataKey *)((long)pdVar4 + lVar12);
                local_2a0 = *(DataKey *)((long)pdVar4 + lVar12);
                local_2a8 = 0.0;
                local_290 = 0;
                local_288.info = 0;
                local_288.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                           (double *)&local_2a0,(double *)&local_2a8,&local_290);
                pdVar4 = (this->super_LPColSetBase<double>).up.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_298.info = 0;
                local_298.idx = 0;
                ::soplex::infinity::__tls_init();
                local_2a0 = local_228;
                local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                local_288.info = 0;
                local_288.idx = -1;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)local_1c0,&local_288,
                           (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                           &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                           (int *)&local_2a8);
              }
              goto LAB_001d772a;
            }
            if (this->thesense == MINIMIZE) {
              local_298 = (DataKey)(*(ulong *)((long)(this->super_LPColSetBase<double>).object.val.
                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar12
                                              ) ^ 0x8000000000000000);
              ::soplex::infinity::__tls_init();
              local_2a0 = local_228;
              local_2a8 = 0.0;
              local_290 = 0;
              local_288.info = 0;
              local_288.idx = -1;
              LPRowSetBase<double>::create
                        ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                         (double *)&local_2a0,(double *)&local_2a8,&local_290);
            }
            else {
              ::soplex::infinity::__tls_init();
              local_298 = local_208;
              uVar1 = *(undefined8 *)
                       ((long)(this->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar12);
              uVar21 = (uint)((ulong)uVar1 >> 0x20);
              if (this->thesense == MINIMIZE) {
                uVar21 = uVar21 ^ 0x80000000;
              }
              local_2a0.idx = uVar21;
              local_2a0.info = (int)uVar1;
              local_2a8 = 0.0;
              local_290 = 0;
              local_288.info = 0;
              local_288.idx = -1;
              LPRowSetBase<double>::create
                        ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                         (double *)&local_2a0,(double *)&local_2a8,&local_290);
            }
          }
          else {
            local_248 = *(DataKey *)
                         ((long)(this->super_LPColSetBase<double>).up.val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
            ::soplex::infinity::__tls_init();
            bVar18 = (double)local_228 <= (double)local_248;
            local_248 = *(DataKey *)
                         ((long)(this->super_LPColSetBase<double>).low.val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
            uStack_240 = 0;
            if (bVar18) {
              pTVar2 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var3 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                }
              }
              RVar6 = Tolerances::epsilon(pTVar2);
              uVar19 = SUB84(RVar6,0);
              uVar20 = (undefined4)((ulong)RVar6 >> 0x20);
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_210 = RVar6;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                uVar19 = SUB84(local_210,0);
                uVar20 = (undefined4)((ulong)local_210 >> 0x20);
              }
              if ((double)CONCAT44(uVar20,uVar19) < ABS((double)local_248)) {
                DSVectorBase<double>::makeMem(&local_268,1);
                local_268.super_SVectorBase<double>.m_elem
                [local_268.super_SVectorBase<double>.memused].idx = iVar15;
                local_268.super_SVectorBase<double>.m_elem
                [local_268.super_SVectorBase<double>.memused].val = 1.0;
                local_268.super_SVectorBase<double>.memused =
                     local_268.super_SVectorBase<double>.memused + 1;
                if (this->thesense == MINIMIZE) {
                  pdVar4 = (this->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_298 = (DataKey)(*(ulong *)((long)pdVar4 + lVar12) ^ 0x8000000000000000);
                  local_2a0 = (DataKey)(*(ulong *)((long)pdVar4 + lVar12) ^ 0x8000000000000000);
                  local_2a8 = 0.0;
                  local_290 = 0;
                  local_288.info = 0;
                  local_288.idx = -1;
                  LPRowSetBase<double>::create
                            ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                             (double *)&local_2a0,(double *)&local_2a8,&local_290);
                  pdVar4 = (this->super_LPColSetBase<double>).low.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_298.info = 0;
                  local_298.idx = 0;
                  ::soplex::infinity::__tls_init();
                  local_2a0 = local_228;
                  local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                  local_288.info = 0;
                  local_288.idx = -1;
                  LPColSetBase<double>::add
                            ((LPColSetBase<double> *)local_1c0,&local_288,
                             (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                             &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                             (int *)&local_2a8);
                }
                else {
                  pdVar4 = (this->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_298 = *(DataKey *)((long)pdVar4 + lVar12);
                  local_2a0 = *(DataKey *)((long)pdVar4 + lVar12);
                  local_2a8 = 0.0;
                  local_290 = 0;
                  local_288.info = 0;
                  local_288.idx = -1;
                  LPRowSetBase<double>::create
                            ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                             (double *)&local_2a0,(double *)&local_2a8,&local_290);
                  pdVar4 = (this->super_LPColSetBase<double>).low.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  ::soplex::infinity::__tls_init();
                  local_298 = local_208;
                  local_2a0.info = 0;
                  local_2a0.idx = 0;
                  local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                  local_288.info = 0;
                  local_288.idx = -1;
                  LPColSetBase<double>::add
                            ((LPColSetBase<double> *)local_1c0,&local_288,
                             (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                             &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                             (int *)&local_2a8);
                }
                goto LAB_001d772a;
              }
              if (this->thesense == MINIMIZE) {
                ::soplex::infinity::__tls_init();
                local_298 = local_208;
                uVar1 = *(undefined8 *)
                         ((long)(this->super_LPColSetBase<double>).object.val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
                uVar21 = (uint)((ulong)uVar1 >> 0x20);
                if (this->thesense == MINIMIZE) {
                  uVar21 = uVar21 ^ 0x80000000;
                }
                local_2a0.idx = uVar21;
                local_2a0.info = (int)uVar1;
                local_2a8 = 0.0;
                local_290 = 0;
                local_288.info = 0;
                local_288.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                           (double *)&local_2a0,(double *)&local_2a8,&local_290);
              }
              else {
                local_298 = *(DataKey *)
                             ((long)(this->super_LPColSetBase<double>).object.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar12);
                ::soplex::infinity::__tls_init();
                local_2a0 = local_228;
                local_2a8 = 0.0;
                local_290 = 0;
                local_288.info = 0;
                local_288.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                           (double *)&local_2a0,(double *)&local_2a8,&local_290);
              }
            }
            else {
              pTVar2 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_210 = *(double *)
                           ((long)(this->super_LPColSetBase<double>).up.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar12);
              p_Var3 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                }
              }
              RVar6 = Tolerances::epsilon(pTVar2);
              uVar19 = SUB84(RVar6,0);
              uVar20 = (undefined4)((ulong)RVar6 >> 0x20);
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_1c8 = RVar6;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                uVar19 = SUB84(local_1c8,0);
                uVar20 = (undefined4)((ulong)local_1c8 >> 0x20);
              }
              if (ABS((double)local_248 - local_210) < (double)CONCAT44(uVar20,uVar19) ||
                  ABS((double)local_248 - local_210) == (double)CONCAT44(uVar20,uVar19)) {
                pdVar4 = (this->super_LPColSetBase<double>).object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar1 = *(undefined8 *)((long)pdVar4 + lVar12);
                uVar21 = (uint)((ulong)uVar1 >> 0x20);
                bVar18 = this->thesense == MINIMIZE;
                if (bVar18) {
                  uVar21 = uVar21 ^ 0x80000000;
                }
                local_298.idx = uVar21;
                local_298.info = (int)uVar1;
                uVar1 = *(undefined8 *)((long)pdVar4 + lVar12);
                uVar21 = (uint)((ulong)uVar1 >> 0x20);
                if (bVar18) {
                  uVar21 = uVar21 ^ 0x80000000;
                }
                local_2a0.idx = uVar21;
                local_2a0.info = (int)uVar1;
                local_2a8 = 0.0;
                local_290 = 0;
                local_288.info = 0;
                local_288.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                           (double *)&local_2a0,(double *)&local_2a8,&local_290);
                DSVectorBase<double>::makeMem(&local_268,1);
                local_268.super_SVectorBase<double>.m_elem
                [local_268.super_SVectorBase<double>.memused].idx = iVar15;
                local_268.super_SVectorBase<double>.m_elem
                [local_268.super_SVectorBase<double>.memused].val = 1.0;
                local_268.super_SVectorBase<double>.memused =
                     local_268.super_SVectorBase<double>.memused + 1;
                pdVar4 = (this->super_LPColSetBase<double>).low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_298.info = 0;
                local_298.idx = 0;
                ::soplex::infinity::__tls_init();
                local_2a0 = local_228;
                local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                local_288.info = 0;
                local_288.idx = -1;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)local_1c0,&local_288,
                           (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                           &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                           (int *)&local_2a8);
                pdVar4 = (this->super_LPColSetBase<double>).low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                ::soplex::infinity::__tls_init();
                local_298 = local_208;
                local_2a0.info = 0;
                local_2a0.idx = 0;
                local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                local_288.info = 0;
                local_288.idx = -1;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)local_1c0,&local_288,
                           (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                           &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                           (int *)&local_2a8);
                local_268.super_SVectorBase<double>._8_8_ =
                     local_268.super_SVectorBase<double>._8_8_ & 0xffffffff;
                local_28c = local_28c + 2;
              }
              else {
                pTVar2 = (this->_tolerances).
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_248 = *(DataKey *)
                             ((long)(this->super_LPColSetBase<double>).low.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar12);
                uStack_240 = 0;
                p_Var3 = (this->_tolerances).
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                  }
                }
                RVar6 = Tolerances::epsilon(pTVar2);
                uVar19 = SUB84(RVar6,0);
                uVar20 = (undefined4)((ulong)RVar6 >> 0x20);
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  local_210 = RVar6;
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                  uVar19 = SUB84(local_210,0);
                  uVar20 = (undefined4)((ulong)local_210 >> 0x20);
                }
                if (ABS((double)local_248) <= (double)CONCAT44(uVar20,uVar19)) {
                  DSVectorBase<double>::makeMem(&local_268,1);
                  local_268.super_SVectorBase<double>.m_elem
                  [local_268.super_SVectorBase<double>.memused].idx = iVar15;
                  local_268.super_SVectorBase<double>.m_elem
                  [local_268.super_SVectorBase<double>.memused].val = 1.0;
                  local_268.super_SVectorBase<double>.memused =
                       local_268.super_SVectorBase<double>.memused + 1;
                  if (this->thesense == MINIMIZE) {
                    ::soplex::infinity::__tls_init();
                    local_298 = local_208;
                    uVar1 = *(undefined8 *)
                             ((long)(this->super_LPColSetBase<double>).object.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar12);
                    uVar21 = (uint)((ulong)uVar1 >> 0x20);
                    if (this->thesense == MINIMIZE) {
                      uVar21 = uVar21 ^ 0x80000000;
                    }
                    local_2a0.idx = uVar21;
                    local_2a0.info = (int)uVar1;
                    local_2a8 = 0.0;
                    local_290 = 0;
                    local_288.info = 0;
                    local_288.idx = -1;
                    LPRowSetBase<double>::create
                              ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                               (double *)&local_2a0,(double *)&local_2a8,&local_290);
                    pdVar4 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    ::soplex::infinity::__tls_init();
                    local_298 = local_208;
                    local_2a0.info = 0;
                    local_2a0.idx = 0;
                    local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                    local_288.info = 0;
                    local_288.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_288,
                               (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                               &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                               (int *)&local_2a8);
                  }
                  else {
                    local_298 = *(DataKey *)
                                 ((long)(this->super_LPColSetBase<double>).object.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar12);
                    ::soplex::infinity::__tls_init();
                    local_2a0 = local_228;
                    local_2a8 = 0.0;
                    local_290 = 0;
                    local_288.info = 0;
                    local_288.idx = -1;
                    LPRowSetBase<double>::create
                              ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                               (double *)&local_2a0,(double *)&local_2a8,&local_290);
                    pdVar4 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    local_298.info = 0;
                    local_298.idx = 0;
                    ::soplex::infinity::__tls_init();
                    local_2a0 = local_228;
                    local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                    local_288.info = 0;
                    local_288.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_288,
                               (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                               &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                               (int *)&local_2a8);
                  }
LAB_001d772a:
                  local_28c = local_28c + 1;
                }
                else {
                  pTVar2 = (this->_tolerances).
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  local_248 = *(DataKey *)
                               ((long)(this->super_LPColSetBase<double>).up.val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar12);
                  uStack_240 = 0;
                  p_Var3 = (this->_tolerances).
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                    }
                  }
                  RVar6 = Tolerances::epsilon(pTVar2);
                  uVar19 = SUB84(RVar6,0);
                  uVar20 = (undefined4)((ulong)RVar6 >> 0x20);
                  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    local_210 = RVar6;
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                    uVar19 = SUB84(local_210,0);
                    uVar20 = (undefined4)((ulong)local_210 >> 0x20);
                  }
                  if (ABS((double)local_248) <= (double)CONCAT44(uVar20,uVar19)) {
                    DSVectorBase<double>::makeMem(&local_268,1);
                    local_268.super_SVectorBase<double>.m_elem
                    [local_268.super_SVectorBase<double>.memused].idx = iVar15;
                    local_268.super_SVectorBase<double>.m_elem
                    [local_268.super_SVectorBase<double>.memused].val = 1.0;
                    local_268.super_SVectorBase<double>.memused =
                         local_268.super_SVectorBase<double>.memused + 1;
                    if (this->thesense == MINIMIZE) {
                      local_298 = (DataKey)(*(ulong *)((long)(this->super_LPColSetBase<double>).
                                                             object.val.
                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar12
                                                  ) ^ 0x8000000000000000);
                      ::soplex::infinity::__tls_init();
                      local_2a0 = local_228;
                      local_2a8 = 0.0;
                      local_290 = 0;
                      local_288.info = 0;
                      local_288.idx = -1;
                      LPRowSetBase<double>::create
                                ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                                 (double *)&local_2a0,(double *)&local_2a8,&local_290);
                      pdVar4 = (this->super_LPColSetBase<double>).low.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_298.info = 0;
                      local_298.idx = 0;
                      ::soplex::infinity::__tls_init();
                      local_2a0 = local_228;
                      local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                      local_288.info = 0;
                      local_288.idx = -1;
                      LPColSetBase<double>::add
                                ((LPColSetBase<double> *)local_1c0,&local_288,
                                 (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                                 &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                                 (int *)&local_2a8);
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_298 = local_208;
                      uVar1 = *(undefined8 *)
                               ((long)(this->super_LPColSetBase<double>).object.val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar12);
                      uVar21 = (uint)((ulong)uVar1 >> 0x20);
                      if (this->thesense == MINIMIZE) {
                        uVar21 = uVar21 ^ 0x80000000;
                      }
                      local_2a0.idx = uVar21;
                      local_2a0.info = (int)uVar1;
                      local_2a8 = 0.0;
                      local_290 = 0;
                      local_288.info = 0;
                      local_288.idx = -1;
                      LPRowSetBase<double>::create
                                ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                                 (double *)&local_2a0,(double *)&local_2a8,&local_290);
                      pdVar4 = (this->super_LPColSetBase<double>).low.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      ::soplex::infinity::__tls_init();
                      local_298 = local_208;
                      local_2a0.info = 0;
                      local_2a0.idx = 0;
                      local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                      local_288.info = 0;
                      local_288.idx = -1;
                      LPColSetBase<double>::add
                                ((LPColSetBase<double> *)local_1c0,&local_288,
                                 (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                                 &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                                 (int *)&local_2a8);
                    }
                    goto LAB_001d772a;
                  }
                  pdVar4 = (this->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar1 = *(undefined8 *)((long)pdVar4 + lVar12);
                  uVar21 = (uint)((ulong)uVar1 >> 0x20);
                  bVar18 = this->thesense == MINIMIZE;
                  if (bVar18) {
                    uVar21 = uVar21 ^ 0x80000000;
                  }
                  local_298.idx = uVar21;
                  local_298.info = (int)uVar1;
                  uVar1 = *(undefined8 *)((long)pdVar4 + lVar12);
                  uVar21 = (uint)((ulong)uVar1 >> 0x20);
                  if (bVar18) {
                    uVar21 = uVar21 ^ 0x80000000;
                  }
                  local_2a0.idx = uVar21;
                  local_2a0.info = (int)uVar1;
                  local_2a8 = 0.0;
                  local_290 = 0;
                  local_288.info = 0;
                  local_288.idx = -1;
                  LPRowSetBase<double>::create
                            ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                             (double *)&local_2a0,(double *)&local_2a8,&local_290);
                  DSVectorBase<double>::makeMem(&local_268,1);
                  local_268.super_SVectorBase<double>.m_elem
                  [local_268.super_SVectorBase<double>.memused].idx = iVar15;
                  local_268.super_SVectorBase<double>.m_elem
                  [local_268.super_SVectorBase<double>.memused].val = 1.0;
                  local_268.super_SVectorBase<double>.memused =
                       local_268.super_SVectorBase<double>.memused + 1;
                  obj = (double *)
                        ((long)(this->super_LPColSetBase<double>).low.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar12);
                  if (this->thesense == MINIMIZE) {
                    local_298.info = 0;
                    local_298.idx = 0;
                    ::soplex::infinity::__tls_init();
                    local_2a0 = local_228;
                    local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                    local_288.info = 0;
                    local_288.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_288,obj,(double *)&local_298
                               ,&local_268.super_SVectorBase<double>,(double *)&local_2a0,
                               (int *)&local_2a8);
                    pdVar4 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    ::soplex::infinity::__tls_init();
                    local_298 = local_208;
                    local_2a0.info = 0;
                    local_2a0.idx = 0;
                    local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                    local_288.info = 0;
                    local_288.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_288,
                               (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                               &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                               (int *)&local_2a8);
                  }
                  else {
                    ::soplex::infinity::__tls_init();
                    local_298 = local_208;
                    local_2a0.info = 0;
                    local_2a0.idx = 0;
                    local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                    local_288.info = 0;
                    local_288.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_288,obj,(double *)&local_298
                               ,&local_268.super_SVectorBase<double>,(double *)&local_2a0,
                               (int *)&local_2a8);
                    pdVar4 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    local_298.info = 0;
                    local_298.idx = 0;
                    ::soplex::infinity::__tls_init();
                    local_2a0 = local_228;
                    local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
                    local_288.info = 0;
                    local_288.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_288,
                               (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                               &local_268.super_SVectorBase<double>,(double *)&local_2a0,
                               (int *)&local_2a8);
                  }
                  local_28c = local_28c + 2;
                }
                local_268.super_SVectorBase<double>._8_8_ =
                     local_268.super_SVectorBase<double>._8_8_ & 0xffffffff;
              }
            }
          }
        }
        else {
          local_248 = *(DataKey *)
                       ((long)(this->super_LPColSetBase<double>).up.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar12);
          ::soplex::infinity::__tls_init();
          if ((double)local_248 < (double)local_228) goto LAB_001d657b;
          pdVar4 = (this->super_LPColSetBase<double>).object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = *(undefined8 *)((long)pdVar4 + lVar12);
          uVar21 = (uint)((ulong)uVar1 >> 0x20);
          bVar18 = this->thesense == MINIMIZE;
          if (bVar18) {
            uVar21 = uVar21 ^ 0x80000000;
          }
          local_298.idx = uVar21;
          local_298.info = (int)uVar1;
          uVar1 = *(undefined8 *)((long)pdVar4 + lVar12);
          uVar21 = (uint)((ulong)uVar1 >> 0x20);
          if (bVar18) {
            uVar21 = uVar21 ^ 0x80000000;
          }
          local_2a0.idx = uVar21;
          local_2a0.info = (int)uVar1;
          local_2a8 = 0.0;
          local_290 = 0;
          local_288.info = 0;
          local_288.idx = -1;
          LPRowSetBase<double>::create
                    ((LPRowSetBase<double> *)local_f8,&local_288,0,(double *)&local_298,
                     (double *)&local_2a0,(double *)&local_2a8,&local_290);
        }
        uVar16 = uVar16 + 1;
        lVar12 = lVar12 + 8;
      } while ((long)uVar16 <
               (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      local_208 = (DataKey)(long)local_28c;
      dualLP = local_230;
    }
    (*(dualLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[8])(dualLP,local_f8,0);
    iVar15 = (int)uVar16;
    if (iVar15 != 0) {
      uVar13 = 0;
      do {
        local_298 = (local_230->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                    [uVar13];
        SPxRowId::SPxRowId((SPxRowId *)&local_288,&local_298);
        local_1e8[uVar13].super_DataKey = local_288;
        uVar13 = uVar13 + 1;
      } while ((uVar16 & 0xffffffff) != uVar13);
    }
    *nprimalcols = iVar15;
    *ndualrows = iVar15;
    if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
      uVar21 = 0;
      pSVar14 = local_230;
    }
    else {
      pDVar8 = (DataKey *)__tls_get_addr(&PTR_003b6b60);
      local_248 = *pDVar8;
      uStack_240 = 0;
      local_228 = (DataKey)((ulong)local_248 ^ 0x8000000000000000);
      uStack_220 = 0x8000000000000000;
      lVar12 = 0;
      lVar17 = 0;
      uVar21 = 0;
      pSVar14 = local_230;
      do {
        TVar7 = LPRowSetBase<double>::type(&this->super_LPRowSetBase<double>,(int)lVar17);
        switch(TVar7) {
        case LESS_EQUAL:
          local_298 = *(DataKey *)
                       ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                               thekey)->info + lVar12);
          SPxRowId::SPxRowId((SPxRowId *)&local_288,&local_298);
          local_1f0[(int)uVar21].super_DataKey = local_288;
          uVar21 = uVar21 + 1;
          if (this->thesense == MINIMIZE) {
            pdVar4 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_298 = local_228;
            local_2a0.info = 0;
            local_2a0.idx = 0;
            local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
            local_288.info = 0;
            local_288.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_288,
                       (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                       (SVectorBase<double> *)
                       ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        set.thekey)->idx + lVar12)),(double *)&local_2a0,
                       (int *)&local_2a8);
          }
          else {
            pdVar4 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_298.info = 0;
            local_298.idx = 0;
            iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar12);
            pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
            ::soplex::infinity::__tls_init();
            local_2a0 = local_248;
            local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
            local_288.info = 0;
            local_288.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_288,
                       (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                       (SVectorBase<double> *)(pIVar5 + iVar15),(double *)&local_2a0,
                       (int *)&local_2a8);
            pSVar14 = local_230;
          }
          break;
        case EQUAL:
          local_298 = *(DataKey *)
                       ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                               thekey)->info + lVar12);
          SPxRowId::SPxRowId((SPxRowId *)&local_288,&local_298);
          local_1f0[(int)uVar21].super_DataKey = local_288;
          pdVar4 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_298 = local_228;
          iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                   thekey)->idx + lVar12);
          pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          ::soplex::infinity::__tls_init();
          local_2a0 = local_248;
          local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
          local_288.info = 0;
          local_288.idx = -1;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)local_1c0,&local_288,(double *)((long)pdVar4 + lVar12),
                     (double *)&local_298,(SVectorBase<double> *)(pIVar5 + iVar15),
                     (double *)&local_2a0,(int *)&local_2a8);
          uVar21 = uVar21 + 1;
          pSVar14 = local_230;
          break;
        case GREATER_EQUAL:
          local_298 = *(DataKey *)
                       ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                               thekey)->info + lVar12);
          SPxRowId::SPxRowId((SPxRowId *)&local_288,&local_298);
          local_1f0[(int)uVar21].super_DataKey = local_288;
          uVar21 = uVar21 + 1;
          if (this->thesense == MINIMIZE) {
            pdVar4 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_298.info = 0;
            local_298.idx = 0;
            iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar12);
            pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
            ::soplex::infinity::__tls_init();
            local_2a0 = local_248;
            local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
            local_288.info = 0;
            local_288.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_288,
                       (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                       (SVectorBase<double> *)(pIVar5 + iVar15),(double *)&local_2a0,
                       (int *)&local_2a8);
            pSVar14 = local_230;
          }
          else {
            pdVar4 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_298 = local_228;
            local_2a0.info = 0;
            local_2a0.idx = 0;
            local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
            local_288.info = 0;
            local_288.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_288,
                       (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                       (SVectorBase<double> *)
                       ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        set.thekey)->idx + lVar12)),(double *)&local_2a0,
                       (int *)&local_2a8);
          }
          break;
        case RANGE:
          local_1e8 = (SPxRowId *)CONCAT44(local_1e8._4_4_,uVar21);
          if (this->thesense == MINIMIZE) {
            local_298 = *(DataKey *)
                         ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->info + lVar12);
            SPxRowId::SPxRowId((SPxRowId *)&local_288,&local_298);
            local_1e0 = (SPxColId *)(long)(int)uVar21;
            local_1f0[(long)local_1e0].super_DataKey = local_288;
            pdVar4 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_298.info = 0;
            local_298.idx = 0;
            iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar12);
            pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
            ::soplex::infinity::__tls_init();
            local_2a0 = local_248;
            local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
            local_288.info = 0;
            local_288.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_288,
                       (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                       (SVectorBase<double> *)(pIVar5 + iVar15),(double *)&local_2a0,
                       (int *)&local_2a8);
            local_298 = *(DataKey *)
                         ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->info + lVar12);
            SPxRowId::SPxRowId((SPxRowId *)&local_288,&local_298);
            pSVar14 = local_230;
            local_1f0[(long)((long)&(local_1e0->super_DataKey).info + 1)].super_DataKey = local_288;
            pdVar4 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = (int)local_1e8;
            ::soplex::infinity::__tls_init();
            local_298 = local_228;
            local_2a0.info = 0;
            local_2a0.idx = 0;
            local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
            local_288.info = 0;
            local_288.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_288,
                       (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                       (SVectorBase<double> *)
                       ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        set.thekey)->idx + lVar12)),(double *)&local_2a0,
                       (int *)&local_2a8);
            uVar21 = iVar15 + 2;
          }
          else {
            local_298 = *(DataKey *)
                         ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->info + lVar12);
            SPxRowId::SPxRowId((SPxRowId *)&local_288,&local_298);
            local_1f0[(int)uVar21].super_DataKey = local_288;
            pdVar4 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_298 = local_228;
            local_2a0.info = 0;
            local_2a0.idx = 0;
            local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
            local_288.info = 0;
            local_288.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_288,
                       (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                       (SVectorBase<double> *)
                       ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        set.thekey)->idx + lVar12)),(double *)&local_2a0,
                       (int *)&local_2a8);
            local_298 = *(DataKey *)
                         ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->info + lVar12);
            SPxRowId::SPxRowId((SPxRowId *)&local_288,&local_298);
            local_1f0[(long)(int)uVar21 + 1].super_DataKey = local_288;
            pdVar4 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_298.info = 0;
            local_298.idx = 0;
            iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar12);
            pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
            iVar10 = (int)local_1e8;
            ::soplex::infinity::__tls_init();
            local_2a0 = local_248;
            local_2a8 = (double)((ulong)local_2a8 & 0xffffffff00000000);
            local_288.info = 0;
            local_288.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_288,
                       (double *)((long)pdVar4 + lVar12),(double *)&local_298,
                       (SVectorBase<double> *)(pIVar5 + iVar15),(double *)&local_2a0,
                       (int *)&local_2a8);
            uVar21 = iVar10 + 2;
            pSVar14 = local_230;
          }
          break;
        default:
          puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_288 = (DataKey)local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_288,"XLPFRD01 This should never happen.","");
          *puVar9 = &PTR__SPxException_003af870;
          puVar9[1] = puVar9 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar9 + 1),local_288,
                     (long)&(local_280->super_DataKey).info + (long)local_288);
          *puVar9 = &PTR__SPxException_003b0638;
          __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        lVar17 = lVar17 + 1;
        lVar12 = lVar12 + 8;
      } while (lVar17 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
    (*(pSVar14->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xd])(pSVar14,local_1c0,0);
    if (0 < (int)uVar21) {
      local_208 = (DataKey)((long)local_208 << 3);
      uVar16 = 0;
      do {
        local_298 = *(DataKey *)
                     ((long)&(pSVar14->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                             thekey[uVar16].info + (long)local_208);
        SPxColId::SPxColId((SPxColId *)&local_288,&local_298);
        local_1d0[uVar16].super_DataKey = local_288;
        uVar16 = uVar16 + 1;
      } while (uVar21 != uVar16);
    }
    *nprimalrows = uVar21;
    *ndualcols = uVar21;
    local_268._vptr_DSVectorBase = local_1d8;
    if (local_268.theelem != (Nonzero<double> *)0x0) {
      free(local_268.theelem);
      local_268.theelem = (Nonzero<double> *)0x0;
    }
    LPColSetBase<double>::~LPColSetBase((LPColSetBase<double> *)local_1c0);
    LPRowSetBase<double>::~LPRowSetBase((LPRowSetBase<double> *)local_f8);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::buildDualProblem(SPxLPBase<R>& dualLP, SPxRowId primalRowIds[],
                                    SPxColId primalColIds[],
                                    SPxRowId dualRowIds[], SPxColId dualColIds[], int* nprimalrows, int* nprimalcols, int* ndualrows,
                                    int* ndualcols)
{
   // Setting up the primalrowids and dualcolids arrays if not given as parameters
   if(primalRowIds == nullptr || primalColIds == nullptr || dualRowIds == nullptr
         || dualColIds == nullptr)
   {
      DataArray < SPxRowId > primalrowids(2 * nRows());
      DataArray < SPxColId > primalcolids(2 * nCols());
      DataArray < SPxRowId > dualrowids(2 * nCols());
      DataArray < SPxColId > dualcolids(2 * nRows());
      int numprimalrows = 0;
      int numprimalcols = 0;
      int numdualrows = 0;
      int numdualcols = 0;

      buildDualProblem(dualLP, primalrowids.get_ptr(), primalcolids.get_ptr(), dualrowids.get_ptr(),
                       dualcolids.get_ptr(), &numprimalrows, &numprimalcols, &numdualrows, &numdualcols);

      if(primalRowIds != nullptr)
      {
         primalRowIds = primalrowids.get_ptr();
         (*nprimalrows) = numprimalrows;
      }

      if(primalColIds != nullptr)
      {
         primalColIds = primalcolids.get_ptr();
         (*nprimalcols) = numprimalcols;
      }

      if(dualRowIds != nullptr)
      {
         dualRowIds = dualrowids.get_ptr();
         (*ndualrows) = numdualrows;
      }

      if(dualColIds != nullptr)
      {
         dualColIds = dualcolids.get_ptr();
         (*ndualcols) = numdualcols;
      }

      return;
   }

   // setting the sense of the dual LP
   if(spxSense() == MINIMIZE)
      dualLP.changeSense(MAXIMIZE);
   else
      dualLP.changeSense(MINIMIZE);

   LPRowSetBase<R> dualrows(nCols());
   LPColSetBase<R> dualcols(nRows());
   DSVectorBase<R> col(1);

   int numAddedRows = 0;
   int numVarBoundCols = 0;
   int primalrowsidx = 0;
   int primalcolsidx = 0;

   for(int i = 0; i < nCols(); ++i)
   {
      primalColIds[primalcolsidx] = cId(i);
      primalcolsidx++;

      if(lower(i) <= R(-infinity) && upper(i) >= R(infinity))   // unrestricted variables
      {
         dualrows.create(0, obj(i), obj(i));
         numAddedRows++;
      }
      else if(lower(i) <= R(-infinity))   // no lower bound is set, indicating a <= 0 variable
      {
         if(isZero(upper(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, obj(i), R(infinity));
            else
               dualrows.create(0, R(-infinity), obj(i));
         }
         else // additional upper bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(upper(i) >= R(infinity))   // no upper bound set, indicating a >= 0 variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, R(-infinity), obj(i));
            else
               dualrows.create(0, obj(i), R(infinity));
         }
         else // additional lower bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(NE(lower(i), upper(i), this->tolerances()->epsilon()))   // a boxed variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // variable bounded between 0 and upper(i)
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }
         else if(isZero(upper(i),
                        this->tolerances()->epsilon()))   // variable bounded between lower(i) and 0
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }
         else // variable bounded between lower(i) and upper(i)
         {
            dualrows.create(0, obj(i), obj(i));

            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualcols.add(lower(i), 0.0, col, R(infinity));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualcols.add(lower(i), R(-infinity), col, 0.0);
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols += 2;
         }

         numAddedRows++;
      }
      else
      {
         assert(lower(i) == upper(i));

         dualrows.create(0, obj(i), obj(i));

         col.add(numAddedRows, 1.0);
         dualcols.add(lower(i), 0, col, R(infinity));
         dualcols.add(lower(i), R(-infinity), col, 0);
         col.clear();

         numVarBoundCols += 2;
         numAddedRows++;
      }
   }

   // adding the empty rows to the dual LP
   dualLP.addRows(dualrows);

   // setting the dual row ids for the related primal cols.
   // this assumes that the rows are added in sequential order.
   for(int i = 0; i < primalcolsidx; i++)
      dualRowIds[i] = dualLP.rId(i);

   (*nprimalcols) = primalcolsidx;
   (*ndualrows) = primalcolsidx;

   // iterating over each of the rows to create dual columns
   for(int i = 0; i < nRows(); ++i)
   {
      // checking the type of the row
      switch(rowType(i))
      {
      case LPRowBase<R>::RANGE: // range constraint, requires the addition of two dual variables
         assert(lhs(i) > R(-infinity));
         assert(rhs(i) < R(infinity));

         if(spxSense() == MINIMIZE)
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         }
         else
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));
         }

         break;

      case LPRowBase<R>::GREATER_EQUAL: // >= constraint
         assert(lhs(i) > R(-infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));
         else
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

         break;

      case LPRowBase<R>::LESS_EQUAL: // <= constriant
         assert(rhs(i) < R(infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         else
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));

         break;

      case LPRowBase<R>::EQUAL: // Equality constraint
         assert(EQ(lhs(i), rhs(i), this->tolerances()->epsilon()));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;
         dualcols.add(rhs(i), R(-infinity), rowVector(i), R(infinity));
         break;

      default:
         throw SPxInternalCodeException("XLPFRD01 This should never happen.");
      }
   }

   // adding the filled columns to the dual LP
   dualLP.addCols(dualcols);

   // setting the dual column ids for the related primal rows.
   // this assumes that the columns are added in sequential order.
   for(int i = 0; i < primalrowsidx; i++)
      dualColIds[i] = dualLP.cId(i + numVarBoundCols);

   (*nprimalrows) = primalrowsidx;
   (*ndualcols) = primalrowsidx;
}